

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O2

bool icu_63::number::impl::blueprint_helpers::parseExponentSignOption
               (StringSegment *segment,MacroProps *macros,UErrorCode *param_3)

{
  int32_t sLength;
  UStringTrieResult UVar1;
  StemEnum stem;
  UNumberSignDisplay exponentSignDisplay;
  bool bVar2;
  Notation NVar3;
  UCharsTrie tempStemTrie;
  ConstChar16Ptr local_98;
  char16_t *local_90;
  char16_t *local_80;
  UCharsTrie local_78;
  UnicodeString local_58;
  
  local_78.ownedArray_ = (char16_t *)0x0;
  local_78.uchars_ = ::(anonymous_namespace)::kSerializedStemTrie;
  local_78.pos_ = ::(anonymous_namespace)::kSerializedStemTrie;
  local_78.remainingMatchLength_ = -1;
  local_80 = ::(anonymous_namespace)::kSerializedStemTrie;
  numparse::impl::StringSegment::toTempUnicodeString(&local_58,segment);
  if ((local_58.fUnion.fStackFields.fLengthAndFlags & 0x11U) == 0) {
    if ((local_58.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
      local_58.fUnion.fFields.fArray = (char16_t *)((long)&local_58.fUnion + 2);
    }
  }
  else {
    local_58.fUnion.fFields.fArray = (char16_t *)0x0;
  }
  local_98.p_ = local_58.fUnion.fFields.fArray;
  sLength = numparse::impl::StringSegment::length(segment);
  UVar1 = UCharsTrie::next(&local_78,&local_98,sLength);
  local_90 = local_98.p_;
  UnicodeString::~UnicodeString(&local_58);
  if (0xfffffffd < UVar1 + ~USTRINGTRIE_INTERMEDIATE_VALUE) {
    stem = UCharsTrie::getValue(&local_78);
    exponentSignDisplay = stem_to_object::signDisplay(stem);
    if (exponentSignDisplay != UNUM_SIGN_COUNT) {
      NVar3 = (Notation)
              ScientificNotation::withExponentSignDisplay
                        ((ScientificNotation *)&macros->notation,exponentSignDisplay);
      macros->notation = NVar3;
      bVar2 = true;
      goto LAB_00265716;
    }
  }
  bVar2 = false;
LAB_00265716:
  UCharsTrie::~UCharsTrie(&local_78);
  return bVar2;
}

Assistant:

bool
blueprint_helpers::parseExponentSignOption(const StringSegment& segment, MacroProps& macros, UErrorCode&) {
    // Get the sign display type out of the CharsTrie data structure.
    UCharsTrie tempStemTrie(kSerializedStemTrie);
    UStringTrieResult result = tempStemTrie.next(
            segment.toTempUnicodeString().getBuffer(),
            segment.length());
    if (result != USTRINGTRIE_INTERMEDIATE_VALUE && result != USTRINGTRIE_FINAL_VALUE) {
        return false;
    }
    auto sign = stem_to_object::signDisplay(static_cast<StemEnum>(tempStemTrie.getValue()));
    if (sign == UNUM_SIGN_COUNT) {
        return false;
    }
    macros.notation = static_cast<ScientificNotation&>(macros.notation).withExponentSignDisplay(sign);
    return true;
}